

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblyEnvironment::SetWasmFunction
          (WebAssemblyEnvironment *this,uint32 index,WasmScriptFunction *func)

{
  Type *ptr;
  Type TVar1;
  uint32 maxCount;
  WebAssemblyModule *pWVar2;
  WriteBarrierPtr<void> **ppWVar3;
  WasmScriptFunction *func_local;
  uint32 index_local;
  WebAssemblyEnvironment *this_local;
  
  pWVar2 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
  TVar1 = WebAssemblyModule::GetFunctionIndexType(pWVar2,index);
  if (TVar1 != Function) {
    pWVar2 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
    TVar1 = WebAssemblyModule::GetFunctionIndexType(pWVar2,index);
    if (TVar1 != ImportThunk) {
      Throw::InternalError();
    }
  }
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->functions);
  ptr = *ppWVar3;
  pWVar2 = Memory::WriteBarrierPtr<Js::WebAssemblyModule>::operator->(&this->module);
  maxCount = WebAssemblyModule::GetWasmFunctionCount(pWVar2);
  SetVarElement<Js::WasmScriptFunction>(this,ptr,func,index,maxCount);
  return;
}

Assistant:

void WebAssemblyEnvironment::SetWasmFunction(uint32 index, WasmScriptFunction* func)
{
    if (!(module->GetFunctionIndexType(index) == Wasm::FunctionIndexTypes::Function ||
          module->GetFunctionIndexType(index) == Wasm::FunctionIndexTypes::ImportThunk))
    {
        Js::Throw::InternalError();
    }
    SetVarElement<WasmScriptFunction>(functions, func, index, module->GetWasmFunctionCount());
}